

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderArrow(ImVec2 p_min,ImGuiDir dir,float scale)

{
  ImDrawList *this;
  undefined4 uVar1;
  undefined4 uVar2;
  ImU32 col;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec4 local_38;
  
  fVar9 = GImGui->FontSize * 0.5;
  fVar10 = fVar9 + p_min.x;
  fVar9 = fVar9 * scale + p_min.y;
  if (dir + 1U < 6) {
    fVar6 = GImGui->FontSize * 0.4 * scale;
    fVar3 = fVar6;
    switch(dir) {
    case 0:
      fVar3 = -fVar6;
    case 1:
      fVar10 = fVar10 + fVar3 * -0.25;
      fVar6 = fVar3 * 0.0;
      fVar4 = fVar3 * -0.5;
      fVar5 = fVar3 * 0.866;
      fVar7 = fVar3 * -0.866;
      fVar8 = fVar4;
      break;
    case 2:
      fVar6 = -fVar6;
    case 3:
      fVar9 = fVar6 * -0.25 + fVar9;
      fVar3 = fVar6 * 0.0;
      fVar4 = fVar6 * -0.866;
      fVar5 = fVar6 * -0.5;
      fVar8 = fVar6 * 0.866;
      fVar7 = fVar5;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x1159,"void ImGui::RenderArrow(ImVec2, ImGuiDir, float)");
    }
  }
  else {
    fVar4 = 0.0;
    fVar5 = 0.0;
    fVar3 = 0.0;
    fVar6 = 0.0;
    fVar8 = 0.0;
    fVar7 = 0.0;
  }
  this = GImGui->CurrentWindow->DrawList;
  local_40.y = fVar6 + fVar9;
  local_40.x = fVar3 + fVar10;
  local_48.y = fVar5 + fVar9;
  local_48.x = fVar4 + fVar10;
  local_50.y = fVar7 + fVar9;
  local_50.x = fVar8 + fVar10;
  local_38.x = (GImGui->Style).Colors[0].x;
  local_38.y = (GImGui->Style).Colors[0].y;
  uVar1 = (GImGui->Style).Colors[0].z;
  uVar2 = (GImGui->Style).Colors[0].w;
  local_38.w = (GImGui->Style).Alpha * (float)uVar2;
  local_38.z = (float)uVar1;
  col = ColorConvertFloat4ToU32(&local_38);
  ImDrawList::AddTriangleFilled(this,&local_40,&local_48,&local_50,col);
  return;
}

Assistant:

void ImGui::RenderArrow(ImVec2 p_min, ImGuiDir dir, float scale)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const float h = g.FontSize * 1.00f;
    float r = h * 0.40f * scale;
    ImVec2 center = p_min + ImVec2(h * 0.50f, h * 0.50f * scale);

    ImVec2 a, b, c;
    switch (dir)
    {
    case ImGuiDir_Up:
    case ImGuiDir_Down:
        if (dir == ImGuiDir_Up) r = -r;
        center.y -= r * 0.25f;
        a = ImVec2(0,1) * r;
        b = ImVec2(-0.866f,-0.5f) * r;
        c = ImVec2(+0.866f,-0.5f) * r;
        break;
    case ImGuiDir_Left:
    case ImGuiDir_Right:
        if (dir == ImGuiDir_Left) r = -r;
        center.x -= r * 0.25f;
        a = ImVec2(1,0) * r;
        b = ImVec2(-0.500f,+0.866f) * r;
        c = ImVec2(-0.500f,-0.866f) * r;
        break;
    case ImGuiDir_None:
    case ImGuiDir_COUNT:
        IM_ASSERT(0);
        break;
    }

    window->DrawList->AddTriangleFilled(center + a, center + b, center + c, GetColorU32(ImGuiCol_Text));
}